

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSynchStateController::GetSignalCount(CSynchStateController *this,LONG *plSignalCount)

{
  uint uVar1;
  CPalThread *pCVar2;
  
  uVar1 = CSynchData::GetSignalCount((this->super_CSynchControllerBase).m_psdSynchData);
  pCVar2 = InternalGetCurrentThread();
  if (pCVar2 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","GetSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x21e);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (plSignalCount == (LONG *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x21f);
    fprintf(_stderr,"Expression: NULL != plSignalCount\n");
  }
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","GetSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x222);
    fprintf(_stderr,
            "Expression: 0 <= lCount, Description: Internal error: negative signal count [signal count=%d]"
            ,(ulong)uVar1);
  }
  *plSignalCount = uVar1;
  return 0;
}

Assistant:

PAL_ERROR CSynchStateController::GetSignalCount(LONG *plSignalCount)
    {
        VALIDATEOBJECT(m_psdSynchData);
                
        PAL_ERROR palErr = NO_ERROR;        
        LONG lCount = m_psdSynchData->GetSignalCount();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(NULL != plSignalCount);
        _ASSERT_MSG(0 <= lCount,
                    "Internal error: negative signal count [signal count=%d]",
                    lCount);

        *plSignalCount = lCount;
        return palErr;
    }